

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-traversal.h
# Opt level: O1

Expression * __thiscall
wasm::ControlFlowWalker<NullFixer,_wasm::SubtypingDiscoverer<NullFixer>_>::findBreakTarget
          (ControlFlowWalker<NullFixer,_wasm::SubtypingDiscoverer<NullFixer>_> *this,Name name)

{
  Id IVar1;
  pointer ppEVar2;
  Expression *pEVar3;
  bool bVar4;
  bool bVar5;
  Expression *pEVar6;
  uint uVar7;
  long lVar8;
  array<wasm::Expression_*,_10UL> *paVar9;
  
  pEVar6 = (Expression *)(this->controlFlowStack).usedFixed;
  ppEVar2 = (this->controlFlowStack).flexible.
            super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  lVar8 = (long)(this->controlFlowStack).flexible.
                super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl.
                super__Vector_impl_data._M_finish - (long)ppEVar2 >> 3;
  if (&pEVar6->_id + lVar8 == (Id *)0x0) {
    __assert_fail("!controlFlowStack.empty()",
                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm-traversal.h"
                  ,0x180,
                  "Expression *wasm::ControlFlowWalker<NullFixer, wasm::SubtypingDiscoverer<NullFixer>>::findBreakTarget(Name) [SubType = NullFixer, VisitorType = wasm::SubtypingDiscoverer<NullFixer>]"
                 );
  }
  uVar7 = ((int)lVar8 + (int)pEVar6) - 1;
  do {
    paVar9 = (array<wasm::Expression_*,_10UL> *)(ppEVar2 + -10);
    if (uVar7 < 10) {
      paVar9 = &(this->controlFlowStack).fixed;
    }
    pEVar3 = paVar9->_M_elems[uVar7];
    IVar1 = pEVar3->_id;
    if (IVar1 < 0x34) {
      if (IVar1 != BlockId) {
        if (IVar1 == IfId) goto LAB_00a755de;
        if (IVar1 != LoopId) goto LAB_00a75624;
        if ((char *)pEVar3[1].type.id != name.super_IString.str._M_str) goto LAB_00a755de;
        bVar4 = false;
        pEVar6 = pEVar3;
        goto LAB_00a755e1;
      }
      if ((char *)pEVar3[1].type.id != name.super_IString.str._M_str) goto LAB_00a755f1;
      bVar4 = false;
      pEVar6 = pEVar3;
    }
    else {
      if (1 < IVar1 - 0x34) {
LAB_00a75624:
        __assert_fail("curr->template is<If>() || curr->template is<Try>() || curr->template is<TryTable>()"
                      ,
                      "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm-traversal.h"
                      ,399,
                      "Expression *wasm::ControlFlowWalker<NullFixer, wasm::SubtypingDiscoverer<NullFixer>>::findBreakTarget(Name) [SubType = NullFixer, VisitorType = wasm::SubtypingDiscoverer<NullFixer>]"
                     );
      }
LAB_00a755de:
      bVar4 = true;
LAB_00a755e1:
      if (bVar4) {
LAB_00a755f1:
        bVar4 = true;
      }
      else {
        bVar4 = false;
      }
    }
    bVar5 = false;
    if (bVar4) {
      if (uVar7 == 0) {
        uVar7 = 0;
        pEVar6 = (Expression *)0x0;
      }
      else {
        uVar7 = uVar7 - 1;
        bVar5 = true;
      }
    }
    else {
      bVar5 = false;
    }
    if (!bVar5) {
      return pEVar6;
    }
  } while( true );
}

Assistant:

Expression* findBreakTarget(Name name) {
    assert(!controlFlowStack.empty());
    Index i = controlFlowStack.size() - 1;
    while (true) {
      auto* curr = controlFlowStack[i];
      if (Block* block = curr->template dynCast<Block>()) {
        if (name == block->name) {
          return curr;
        }
      } else if (Loop* loop = curr->template dynCast<Loop>()) {
        if (name == loop->name) {
          return curr;
        }
      } else {
        // an if, try, or try_table, ignorable
        assert(curr->template is<If>() || curr->template is<Try>() ||
               curr->template is<TryTable>());
      }
      if (i == 0) {
        return nullptr;
      }
      i--;
    }
  }